

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

int cookie_output(Curl_easy *data,CookieInfo *c,char *filename)

{
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  void *__base;
  char *pcVar4;
  char *format_ptr;
  Cookie **array;
  size_t nvalid;
  uint i;
  uchar randsuffix [9];
  _Bool error;
  char *tempstore;
  FILE *pFStack_38;
  _Bool use_stdout;
  FILE *out;
  Cookie *co;
  char *filename_local;
  CookieInfo *c_local;
  Curl_easy *data_local;
  
  bVar1 = false;
  stack0xffffffffffffffb8 = (char *)0x0;
  randsuffix[1] = '\0';
  if (c == (CookieInfo *)0x0) {
    return 0;
  }
  remove_expired(c);
  iVar2 = strcmp("-",filename);
  if (iVar2 == 0) {
    pFStack_38 = _stdout;
    bVar1 = true;
LAB_00113303:
    fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,pFStack_38);
    if (c->numcookies != 0) {
      array = (Cookie **)0x0;
      __base = (*Curl_ccalloc)(1,c->numcookies << 3);
      if (__base == (void *)0x0) goto LAB_001134b0;
      for (nvalid._0_4_ = 0; (uint)nvalid < 0x100; nvalid._0_4_ = (uint)nvalid + 1) {
        for (out = (FILE *)c->cookies[(uint)nvalid]; out != (FILE *)0x0; out = *(FILE **)out) {
          if (out->_IO_write_ptr != (char *)0x0) {
            *(FILE **)((long)__base + (long)array * 8) = out;
            array = (Cookie **)((long)array + 1);
          }
        }
      }
      qsort(__base,(size_t)array,8,cookie_sort_ct);
      for (nvalid._0_4_ = 0; (Cookie **)(ulong)(uint)nvalid < array; nvalid._0_4_ = (uint)nvalid + 1
          ) {
        pcVar4 = get_netscape_format(*(Cookie **)((long)__base + (ulong)(uint)nvalid * 8));
        if (pcVar4 == (char *)0x0) {
          curl_mfprintf((FILE *)pFStack_38,"#\n# Fatal libcurl error\n");
          (*Curl_cfree)(__base);
          goto LAB_001134b0;
        }
        curl_mfprintf((FILE *)pFStack_38,"%s\n",pcVar4);
        (*Curl_cfree)(pcVar4);
      }
      (*Curl_cfree)(__base);
    }
    if ((pFStack_38 == (FILE *)0x0) || (bVar1)) goto LAB_001134b4;
    fclose(pFStack_38);
    pFStack_38 = (FILE *)0x0;
    iVar2 = Curl_rename(stack0xffffffffffffffb8,filename);
    if (iVar2 == 0) goto LAB_001134b4;
    unlink(stack0xffffffffffffffb8);
  }
  else {
    CVar3 = Curl_rand_hex(data,(uchar *)((long)&nvalid + 6),9);
    if (CVar3 != CURLE_OK) {
      return 2;
    }
    register0x00000000 = curl_maprintf("%s.%s.tmp",filename,(long)&nvalid + 6);
    if (register0x00000000 == (char *)0x0) {
      return 1;
    }
    pFStack_38 = fopen64(register0x00000000,"w");
    if (pFStack_38 != (FILE *)0x0) goto LAB_00113303;
  }
LAB_001134b0:
  randsuffix[1] = '\x01';
LAB_001134b4:
  if ((pFStack_38 != (FILE *)0x0) && (!bVar1)) {
    fclose(pFStack_38);
  }
  (*Curl_cfree)(stack0xffffffffffffffb8);
  return (uint)((randsuffix[1] & 1) != 0);
}

Assistant:

static int cookie_output(struct Curl_easy *data,
                         struct CookieInfo *c, const char *filename)
{
  struct Cookie *co;
  FILE *out = NULL;
  bool use_stdout = FALSE;
  char *tempstore = NULL;
  bool error = false;

  if(!c)
    /* no cookie engine alive */
    return 0;

  /* at first, remove expired cookies */
  remove_expired(c);

  if(!strcmp("-", filename)) {
    /* use stdout */
    out = stdout;
    use_stdout = TRUE;
  }
  else {
    unsigned char randsuffix[9];

    if(Curl_rand_hex(data, randsuffix, sizeof(randsuffix)))
      return 2;

    tempstore = aprintf("%s.%s.tmp", filename, randsuffix);
    if(!tempstore)
      return 1;

    out = fopen(tempstore, FOPEN_WRITETEXT);
    if(!out)
      goto error;
  }

  fputs("# Netscape HTTP Cookie File\n"
        "# https://curl.haxx.se/docs/http-cookies.html\n"
        "# This file was generated by libcurl! Edit at your own risk.\n\n",
        out);

  if(c->numcookies) {
    unsigned int i;
    size_t nvalid = 0;
    struct Cookie **array;

    array = calloc(1, sizeof(struct Cookie *) * c->numcookies);
    if(!array) {
      goto error;
    }

    /* only sort the cookies with a domain property */
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      for(co = c->cookies[i]; co; co = co->next) {
        if(!co->domain)
          continue;
        array[nvalid++] = co;
      }
    }

    qsort(array, nvalid, sizeof(struct Cookie *), cookie_sort_ct);

    for(i = 0; i < nvalid; i++) {
      char *format_ptr = get_netscape_format(array[i]);
      if(format_ptr == NULL) {
        fprintf(out, "#\n# Fatal libcurl error\n");
        free(array);
        goto error;
      }
      fprintf(out, "%s\n", format_ptr);
      free(format_ptr);
    }

    free(array);
  }

  if(out && !use_stdout) {
    fclose(out);
    out = NULL;
    if(Curl_rename(tempstore, filename)) {
      unlink(tempstore);
      goto error;
    }
  }

  goto cleanup;
error:
  error = true;
cleanup:
  if(out && !use_stdout)
    fclose(out);
  free(tempstore);
  return error ? 1 : 0;
}